

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Param * __thiscall
kratos::Generator::parameter(Generator *this,string *parameter_name,uint32_t width,bool is_signed)

{
  Param *pPVar1;
  Generator *local_50;
  uint32_t local_44;
  Param *pPStack_40;
  uint32_t width_local;
  shared_ptr<kratos::Param> ptr;
  bool is_signed_local;
  
  local_44 = width;
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ =
       is_signed;
  check_param_name_conflict(this,parameter_name);
  pPStack_40 = (Param *)0x0;
  local_50 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::Param,std::allocator<kratos::Param>,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,bool&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptr,&stack0xffffffffffffffc0,
             (allocator<kratos::Param> *)
             ((long)&ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 6),&local_50,parameter_name,&local_44,
             (bool *)((long)&ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
  std::__shared_ptr<kratos::Param,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::Param,kratos::Param>
            ((__shared_ptr<kratos::Param,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
             pPStack_40);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,parameter_name,(shared_ptr<kratos::Param> *)&stack0xffffffffffffffc0)
  ;
  pPVar1 = pPStack_40;
  if (ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pPVar1;
}

Assistant:

Param &Generator::parameter(const std::string &parameter_name, uint32_t width, bool is_signed) {
    check_param_name_conflict(parameter_name);
    auto ptr = std::make_shared<Param>(this, parameter_name, width, is_signed);
    params_.emplace(parameter_name, ptr);
    return *ptr;
}